

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

void __thiscall ON_V4V5_MeshNgonList::V4V5_Destroy(ON_V4V5_MeshNgonList *this)

{
  ON_NGON_MEMBLK *memblock;
  ON_NGON_MEMBLK *pOVar1;
  
  this->m_ngons_count = 0;
  this->m_ngons_capacity = 0;
  if (this->m_ngons != (ON_V4V5_MeshNgon *)0x0) {
    onfree(this->m_ngons);
    this->m_ngons = (ON_V4V5_MeshNgon *)0x0;
  }
  memblock = this->m_memblk_list;
  this->m_memblk_list = (ON_NGON_MEMBLK *)0x0;
  while (memblock != (ON_NGON_MEMBLK *)0x0) {
    pOVar1 = memblock->next;
    onfree(memblock);
    memblock = pOVar1;
  }
  return;
}

Assistant:

void ON_V4V5_MeshNgonList::V4V5_Destroy()
{
  m_ngons_count = 0;
  m_ngons_capacity = 0;
  if ( 0 != m_ngons )
  {
    onfree(m_ngons);
    m_ngons = 0;
  }
  struct ON_NGON_MEMBLK* p = m_memblk_list;
  m_memblk_list = 0;
  while(p)
  {
    struct ON_NGON_MEMBLK* next = p->next;
    onfree(p);
    p = next;
  }
}